

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

Token * next(Token *__return_storage_ptr__,vector<Token,_std::allocator<Token>_> *input,int index)

{
  int iVar1;
  reference other;
  vector<Token,_std::allocator<Token>_> local_38;
  int local_1c;
  vector<Token,_std::allocator<Token>_> *pvStack_18;
  int index_local;
  vector<Token,_std::allocator<Token>_> *input_local;
  
  local_1c = index;
  pvStack_18 = input;
  input_local = (vector<Token,_std::allocator<Token>_> *)__return_storage_ptr__;
  std::vector<Token,_std::allocator<Token>_>::vector(&local_38,input);
  iVar1 = nextIndex(&local_38,local_1c);
  other = std::vector<Token,_std::allocator<Token>_>::operator[](input,(long)iVar1);
  Token::Token(__return_storage_ptr__,other);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Token next(vector<Token> input, int index) {
	return input[nextIndex(input, index)];
}